

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetArrayBufferExtraInfo(JsValueRef arrayBuffer,char *extraInfo)

{
  bool bVar1;
  char cVar2;
  ArrayBuffer *this;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  char *extraInfo_local;
  JsValueRef arrayBuffer_local;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (extraInfo == (char *)0x0) {
    arrayBuffer_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)extraInfo;
    DebugCheckNoException::DebugCheckNoException(&local_28);
    bVar1 = Js::VarIs<Js::ArrayBuffer>(arrayBuffer);
    if (bVar1) {
      this = Js::VarTo<Js::ArrayBuffer>(arrayBuffer);
      cVar2 = Js::ArrayBufferBase::GetExtraInfoBits(&this->super_ArrayBufferBase);
      *(char *)__debugCheckNoException = cVar2;
    }
    else {
      arrayBuffer_local._4_4_ = JsErrorInvalidArgument;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
    if (bVar1) {
      arrayBuffer_local._4_4_ = JsNoError;
    }
  }
  return arrayBuffer_local._4_4_;
}

Assistant:

CHAKRA_API
JsGetArrayBufferExtraInfo(
    _In_ JsValueRef arrayBuffer,
    _Out_ char *extraInfo)
{
    VALIDATE_JSREF(arrayBuffer);
    PARAM_NOT_NULL(extraInfo);
    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        *extraInfo = Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->GetExtraInfoBits();
    }